

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::FunctionCase::setGeneralUniforms
          (FunctionCase *this,deUint32 program)

{
  glUniform1fFunc p_Var1;
  glGetUniformLocationFunc p_Var2;
  GLuint GVar3;
  bool bVar4;
  int iVar5;
  GLint GVar6;
  undefined4 extraout_var;
  GLchar *pGVar7;
  int local_14c;
  float local_148;
  int i_3;
  float values_3 [16];
  int local_fc;
  int size;
  int i_2;
  int values_2 [4];
  int local_dc;
  int local_d8;
  int i_1;
  int values_1 [4];
  int local_bc;
  float local_b8;
  int i;
  float values [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  GLint local_30;
  int local_2c;
  int location;
  int scalarSize;
  DataType paramType;
  int paramNdx;
  Functions *gl;
  FunctionCase *pFStack_10;
  deUint32 program_local;
  FunctionCase *this_local;
  
  gl._4_4_ = program;
  pFStack_10 = this;
  iVar5 = (*((this->super_OperatorPerformanceCase).m_renderCtx)->_vptr_RenderContext[3])();
  _paramType = (Functions *)CONCAT44(extraout_var,iVar5);
  p_Var1 = _paramType->uniform1f;
  GVar6 = (*_paramType->getUniformLocation)(gl._4_4_,"u_zero");
  (*p_Var1)(GVar6,0.0);
  for (scalarSize = 0; scalarSize < 3; scalarSize = scalarSize + 1) {
    if (this->m_paramTypes[scalarSize] != TYPE_INVALID) {
      location = this->m_paramTypes[scalarSize];
      local_2c = glu::getDataTypeScalarSize(location);
      GVar3 = gl._4_4_;
      p_Var2 = _paramType->getUniformLocation;
      std::__cxx11::string::string((string *)&local_90);
      std::operator+(&local_70,&local_90,"u_inc");
      std::operator+(&local_50,&local_70,(char)scalarSize + 'A');
      pGVar7 = (GLchar *)std::__cxx11::string::c_str();
      GVar6 = (*p_Var2)(GVar3,pGVar7);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      local_30 = GVar6;
      bVar4 = glu::isDataTypeFloatOrVec(location);
      if (bVar4) {
        for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
          (&local_b8)[local_bc] = (float)scalarSize * 0.01 + (float)local_bc * 0.001;
        }
        uniformNfv(_paramType,local_2c,local_30,1,&local_b8);
      }
      else {
        bVar4 = glu::isDataTypeIntOrIVec(location);
        if (bVar4) {
          for (local_dc = 0; local_dc < 4; local_dc = local_dc + 1) {
            (&local_d8)[local_dc] = scalarSize * 100 + local_dc;
          }
          uniformNiv(_paramType,local_2c,local_30,1,&local_d8);
        }
        else {
          bVar4 = glu::isDataTypeBoolOrBVec(location);
          if (bVar4) {
            for (local_fc = 0; local_fc < 4; local_fc = local_fc + 1) {
              (&size)[local_fc] = scalarSize >> ((byte)local_fc & 0x1f) & 1;
            }
            uniformNiv(_paramType,local_2c,local_30,1,&size);
          }
          else {
            bVar4 = glu::isDataTypeMatrix(location);
            if (bVar4) {
              iVar5 = glu::getDataTypeMatrixNumRows(location);
              for (local_14c = 0; local_14c < 0x10; local_14c = local_14c + 1) {
                (&local_148)[local_14c] = (float)scalarSize * 0.01 + (float)local_14c * 0.001;
              }
              uniformMatrixNfv(_paramType,iVar5,local_30,1,&local_148);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionCase::setGeneralUniforms (deUint32 program) const
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	gl.uniform1f(gl.getUniformLocation(program, "u_zero"), 0.0f);

	for (int paramNdx = 0; paramNdx < MAX_PARAMS; paramNdx++)
	{
		if (m_paramTypes[paramNdx] != glu::TYPE_INVALID)
		{
			const glu::DataType		paramType	= m_paramTypes[paramNdx];
			const int				scalarSize	= glu::getDataTypeScalarSize(paramType);
			const int				location	= gl.getUniformLocation(program, (string() + "u_inc" + (char)('A'+paramNdx)).c_str());

			if (glu::isDataTypeFloatOrVec(paramType))
			{
				float values[4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = (float)paramNdx*0.01f + (float)i*0.001f; // Arbitrary small values.
				uniformNfv(gl, scalarSize, location, 1, &values[0]);
			}
			else if (glu::isDataTypeIntOrIVec(paramType))
			{
				int values[4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = paramNdx*100 + i; // Arbitrary values.
				uniformNiv(gl, scalarSize, location, 1, &values[0]);
			}
			else if (glu::isDataTypeBoolOrBVec(paramType))
			{
				int values[4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = (paramNdx >> i) & 1; // Arbitrary values.
				uniformNiv(gl, scalarSize, location, 1, &values[0]);
			}
			else if (glu::isDataTypeMatrix(paramType))
			{
				const int size = glu::getDataTypeMatrixNumRows(paramType);
				DE_ASSERT(size == glu::getDataTypeMatrixNumColumns(paramType));
				float values[4*4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = (float)paramNdx*0.01f + (float)i*0.001f; // Arbitrary values.
				uniformMatrixNfv(gl, size, location, 1, &values[0]);
			}
			else
				DE_ASSERT(false);
		}
	}
}